

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAndRgEa<(moira::Instr)59,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  uint op1;
  u32 uVar3;
  ushort in_SI;
  u32 *in_RDI;
  u32 result;
  u32 data;
  u32 ea;
  int dst;
  int src;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  u32 in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = (int)(uint)in_SI >> 9 & 7;
  op1 = in_SI & 7;
  bVar1 = readOp<(moira::Mode)0,(moira::Size)2,0ul>
                    ((Moira *)(CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,
                                                       (int)(uint)in_SI >> 9)) & 0xffffffff00000007)
                     ,op1,(u32 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_RDI);
  if (bVar1) {
    readD<(moira::Size)2>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20));
    uVar3 = logic<(moira::Instr)59,(moira::Size)2>
                      ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
                       in_stack_ffffffffffffffe8);
    bVar1 = isMemMode(MODE_DN);
    if (bVar1) {
      prefetch<0ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar3));
    }
    else {
      prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar3));
    }
    writeOp<(moira::Mode)0,(moira::Size)2,5ul>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar3),(int)((ulong)in_RDI >> 0x20),
               (u32)in_RDI,0);
  }
  return;
}

Assistant:

void
Moira::execAndRgEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    u32 result = logic<I,S>(readD<S>(src), data);
    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(4);
    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}